

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  char *pcVar1;
  size_t __nmemb;
  symbol **ppsVar2;
  symbol *psVar3;
  ushort *puVar4;
  void *__ptr;
  int iVar5;
  uint uVar6;
  int iVar7;
  void *__s;
  size_t sVar8;
  size_t sVar9;
  symbol *__s1;
  ushort **ppuVar10;
  char *pcVar11;
  ulong uVar12;
  symbol *psVar13;
  char *pcVar14;
  char cVar15;
  symbol *__s2;
  symbol *psVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  
  iVar7 = lemp->nsymbol;
  lVar17 = (long)iVar7;
  __nmemb = lVar17 * 2;
  __s2 = (symbol *)0x8;
  __s = calloc(__nmemb,8);
  uVar20 = (uint)__nmemb;
  if (0 < lVar17) {
    uVar12 = 1;
    if (1 < (int)uVar20) {
      uVar12 = __nmemb & 0xffffffff;
    }
    __s2 = (symbol *)0x0;
    memset(__s,0,uVar12 << 3);
  }
  pcVar14 = lemp->vartype;
  if (pcVar14 == (char *)0x0) {
    sVar8 = 0;
  }
  else {
    sVar8 = strlen(pcVar14);
  }
  iVar5 = (int)sVar8;
  if (0 < iVar7) {
    ppsVar2 = lemp->symbols;
    lVar18 = 0;
    do {
      pcVar19 = ppsVar2[lVar18]->datatype;
      if (pcVar19 != (char *)0x0) {
        sVar9 = strlen(pcVar19);
        uVar6 = (uint)sVar9;
        if ((int)(uint)sVar9 < (int)(uint)sVar8) {
          uVar6 = (uint)sVar8;
        }
        sVar8 = (size_t)uVar6;
      }
      iVar5 = (int)sVar8;
      lVar18 = lVar18 + 1;
    } while (lVar17 != lVar18);
  }
  psVar16 = (symbol *)(long)(iVar5 * 2 + 1);
  __s1 = (symbol *)malloc((size_t)psVar16);
  if ((__s == (void *)0x0) || (__s1 == (symbol *)0x0)) {
LAB_0010ae4d:
    print_stack_union_cold_2();
    iVar7 = __s2->type - psVar16->type;
    if (iVar7 == 0) {
      iVar7 = *(int *)&__s2->rule - *(int *)&psVar16->rule;
    }
    if ((psVar16 != __s2) && (iVar7 == 0)) {
      __assert_fail("c!=0 || p1==p2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                    ,0xe1f,"int axset_compare(const void *, const void *)");
    }
    return;
  }
  if (0 < iVar7) {
    ppsVar2 = lemp->symbols;
    psVar3 = lemp->errsym;
    lVar18 = 0;
    do {
      psVar16 = ppsVar2[lVar18];
      if (psVar16 == psVar3) {
        psVar16->dtnum = uVar20 | 1;
      }
      else if ((psVar16->type == NONTERMINAL) &&
              (pcVar19 = psVar16->datatype, pcVar14 != (char *)0x0 || pcVar19 != (char *)0x0)) {
        if (pcVar19 == (char *)0x0) {
          pcVar19 = pcVar14;
        }
        ppuVar10 = __ctype_b_loc();
        puVar4 = *ppuVar10;
        pcVar11 = pcVar19 + -1;
        do {
          pcVar19 = pcVar19 + 1;
          pcVar1 = pcVar11 + 1;
          pcVar11 = pcVar11 + 1;
        } while ((*(byte *)((long)puVar4 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
        uVar12 = 0;
        cVar15 = *pcVar11;
        while (cVar15 != '\0') {
          *(char *)((long)&__s1->name + uVar12) = cVar15;
          uVar12 = uVar12 + 1;
          cVar15 = *pcVar19;
          pcVar19 = pcVar19 + 1;
        }
        if (0 < (int)uVar12) {
          do {
            iVar5 = (int)uVar12;
            if ((*(byte *)((long)puVar4 +
                          (long)*(char *)((long)__s1 + ((uVar12 & 0xffffffff) - 1)) * 2 + 1) & 0x20)
                == 0) goto LAB_0010ab5e;
            uVar12 = (ulong)(iVar5 - 1);
          } while (1 < iVar5);
          uVar12 = 0;
        }
LAB_0010ab5e:
        *(char *)((long)&__s1->name + (long)(int)uVar12) = '\0';
        __s2 = (symbol *)lemp->tokentype;
        if ((__s2 == (symbol *)0x0) || (iVar5 = strcmp((char *)__s1,(char *)__s2), iVar5 != 0)) {
          cVar15 = *(char *)&__s1->name;
          uVar6 = 0;
          psVar13 = __s1;
          if (cVar15 != '\0') {
            do {
              psVar13 = (symbol *)((long)&psVar13->name + 1);
              __s2 = (symbol *)(ulong)(uVar6 * 0x35);
              uVar6 = (int)cVar15 + uVar6 * 0x35;
              cVar15 = *(char *)&psVar13->name;
            } while (cVar15 != '\0');
            uVar6 = uVar6 & 0x7fffffff;
          }
          uVar12 = (ulong)uVar6 % (__nmemb & 0xffffffff);
          uVar6 = (uint)uVar12;
          pcVar19 = *(char **)((long)__s + uVar12 * 8);
          bVar22 = pcVar19 == (char *)0x0;
          if (!bVar22) {
            __s2 = __s1;
            iVar5 = strcmp(pcVar19,(char *)__s1);
            while (uVar6 = (uint)uVar12, iVar5 != 0) {
              uVar6 = uVar6 + 1;
              if ((int)uVar20 <= (int)uVar6) {
                uVar6 = 0;
              }
              uVar12 = (ulong)uVar6;
              pcVar19 = *(char **)((long)__s + uVar12 * 8);
              bVar22 = pcVar19 == (char *)0x0;
              if (bVar22) goto LAB_0010ac35;
              __s2 = __s1;
              iVar5 = strcmp(pcVar19,(char *)__s1);
            }
            psVar16->dtnum = uVar6 + 1;
            __s2 = psVar3;
            if (!bVar22) goto LAB_0010ac78;
          }
LAB_0010ac35:
          psVar16->dtnum = uVar6 + 1;
          sVar8 = strlen((char *)__s1);
          psVar16 = (symbol *)(long)((int)sVar8 + 1);
          pcVar19 = (char *)malloc((size_t)psVar16);
          *(char **)((long)__s + uVar12 * 8) = pcVar19;
          if (pcVar19 == (char *)0x0) {
            print_stack_union_cold_1();
            goto LAB_0010ae4d;
          }
          strcpy(pcVar19,(char *)__s1);
        }
        else {
          psVar16->dtnum = 0;
        }
      }
      else {
        psVar16->dtnum = 0;
      }
LAB_0010ac78:
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar17);
  }
  pcVar14 = "Parse";
  if (lemp->name != (char *)0x0) {
    pcVar14 = lemp->name;
  }
  iVar5 = *plineno;
  if (mhflag != 0) {
    fwrite("#if INTERFACE\n",0xe,1,(FILE *)out);
    iVar5 = iVar5 + 1;
  }
  pcVar19 = "void*";
  if (lemp->tokentype != (char *)0x0) {
    pcVar19 = lemp->tokentype;
  }
  fprintf((FILE *)out,"#define %sTOKENTYPE %s\n",pcVar14,pcVar19);
  if (mhflag == 0) {
    iVar5 = iVar5 + 1;
  }
  else {
    fwrite("#endif\n",7,1,(FILE *)out);
    iVar5 = iVar5 + 2;
  }
  fwrite("typedef union {\n",0x10,1,(FILE *)out);
  fwrite("  int yyinit;\n",0xe,1,(FILE *)out);
  fprintf((FILE *)out,"  %sTOKENTYPE yy0;\n",pcVar14);
  iVar5 = iVar5 + 3;
  if (0 < iVar7) {
    uVar12 = 1;
    if (1 < (int)uVar20) {
      uVar12 = __nmemb & 0xffffffff;
    }
    uVar21 = 0;
    do {
      __ptr = *(void **)((long)__s + uVar21 * 8);
      if (__ptr != (void *)0x0) {
        fprintf((FILE *)out,"  %s yy%d;\n",__ptr,(ulong)((int)uVar21 + 1));
        iVar5 = iVar5 + 1;
        free(__ptr);
      }
      uVar21 = uVar21 + 1;
    } while (uVar12 != uVar21);
  }
  if (lemp->errsym->useCnt != 0) {
    fprintf((FILE *)out,"  int yy%d;\n",(ulong)(uint)lemp->errsym->dtnum);
    iVar5 = iVar5 + 1;
  }
  free(__s1);
  free(__s);
  fwrite("} YYMINORTYPE;\n",0xf,1,(FILE *)out);
  *plineno = iVar5 + 1;
  return;
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = 0;           /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  int hash;                 /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( types==0 || stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( isspace(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && isspace(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}